

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

void llvm::APInt::udivrem(APInt *LHS,APInt *RHS,APInt *Quotient,APInt *Remainder)

{
  ulong uVar1;
  uint64_t *puVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  uint64_t rhsValue;
  uint64_t lhsValue;
  APInt local_c0;
  APInt local_b0;
  APInt local_a0;
  APInt local_90;
  APInt local_80;
  uint local_6c;
  uint local_68;
  uint rhsWords;
  uint rhsBits;
  uint lhsWords;
  APInt local_50;
  ulong local_40;
  uint64_t RemVal;
  uint64_t QuotVal;
  APInt *pAStack_28;
  uint BitWidth;
  APInt *Remainder_local;
  APInt *Quotient_local;
  APInt *RHS_local;
  APInt *LHS_local;
  
  pAStack_28 = Remainder;
  Remainder_local = Quotient;
  Quotient_local = RHS;
  RHS_local = LHS;
  if (LHS->BitWidth != RHS->BitWidth) {
    __assert_fail("LHS.BitWidth == RHS.BitWidth && \"Bit widths must be the same\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x6b5,
                  "static void llvm::APInt::udivrem(const APInt &, const APInt &, APInt &, APInt &)"
                 );
  }
  QuotVal._4_4_ = LHS->BitWidth;
  bVar3 = isSingleWord(LHS);
  if (bVar3) {
    if ((Quotient_local->U).VAL == 0) {
      __assert_fail("RHS.U.VAL != 0 && \"Divide by zero?\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x6ba,
                    "static void llvm::APInt::udivrem(const APInt &, const APInt &, APInt &, APInt &)"
                   );
    }
    RemVal = (RHS_local->U).VAL / (Quotient_local->U).VAL;
    local_40 = (RHS_local->U).VAL % (Quotient_local->U).VAL;
    APInt(&local_50,QuotVal._4_4_,RemVal,false);
    operator=(Remainder_local,&local_50);
    ~APInt(&local_50);
    APInt((APInt *)&rhsBits,QuotVal._4_4_,local_40,false);
    operator=(pAStack_28,(APInt *)&rhsBits);
    ~APInt((APInt *)&rhsBits);
  }
  else {
    uVar4 = getActiveBits(RHS_local);
    rhsWords = getNumWords(uVar4);
    local_68 = getActiveBits(Quotient_local);
    local_6c = getNumWords(local_68);
    if (local_6c == 0) {
      __assert_fail("rhsWords && \"Performing divrem operation by zero ???\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x6c6,
                    "static void llvm::APInt::udivrem(const APInt &, const APInt &, APInt &, APInt &)"
                   );
    }
    if (rhsWords == 0) {
      APInt(&local_80,QuotVal._4_4_,0,false);
      operator=(Remainder_local,&local_80);
      ~APInt(&local_80);
      APInt(&local_90,QuotVal._4_4_,0,false);
      operator=(pAStack_28,&local_90);
      ~APInt(&local_90);
    }
    else {
      if (local_68 == 1) {
        operator=(Remainder_local,RHS_local);
        APInt(&local_a0,QuotVal._4_4_,0,false);
        operator=(pAStack_28,&local_a0);
        ~APInt(&local_a0);
      }
      if ((rhsWords < local_6c) || (bVar3 = ult(RHS_local,Quotient_local), bVar3)) {
        operator=(pAStack_28,RHS_local);
        APInt(&local_b0,QuotVal._4_4_,0,false);
        operator=(Remainder_local,&local_b0);
        ~APInt(&local_b0);
      }
      else {
        bVar3 = operator==(RHS_local,Quotient_local);
        if (bVar3) {
          APInt(&local_c0,QuotVal._4_4_,1,false);
          operator=(Remainder_local,&local_c0);
          ~APInt(&local_c0);
          APInt((APInt *)&lhsValue,QuotVal._4_4_,0,false);
          operator=(pAStack_28,(APInt *)&lhsValue);
          ~APInt((APInt *)&lhsValue);
        }
        else {
          reallocate(Remainder_local,QuotVal._4_4_);
          reallocate(pAStack_28,QuotVal._4_4_);
          if (rhsWords == 1) {
            uVar5 = *(RHS_local->U).pVal;
            uVar1 = *(Quotient_local->U).pVal;
            operator=(Remainder_local,uVar5 / uVar1);
            operator=(pAStack_28,uVar5 % uVar1);
          }
          else {
            divide((RHS_local->U).pVal,rhsWords,(Quotient_local->U).pVal,local_6c,
                   (Remainder_local->U).pVal,(pAStack_28->U).pVal);
            puVar2 = (Remainder_local->U).pVal;
            uVar5 = (ulong)rhsWords;
            uVar4 = getNumWords(QuotVal._4_4_);
            memset(puVar2 + uVar5,0,(ulong)((uVar4 - rhsWords) * 8));
            puVar2 = (pAStack_28->U).pVal;
            uVar5 = (ulong)local_6c;
            uVar4 = getNumWords(QuotVal._4_4_);
            memset(puVar2 + uVar5,0,(ulong)((uVar4 - local_6c) * 8));
          }
        }
      }
    }
  }
  return;
}

Assistant:

void APInt::udivrem(const APInt &LHS, const APInt &RHS,
                    APInt &Quotient, APInt &Remainder) {
  assert(LHS.BitWidth == RHS.BitWidth && "Bit widths must be the same");
  unsigned BitWidth = LHS.BitWidth;

  // First, deal with the easy case
  if (LHS.isSingleWord()) {
    assert(RHS.U.VAL != 0 && "Divide by zero?");
    uint64_t QuotVal = LHS.U.VAL / RHS.U.VAL;
    uint64_t RemVal = LHS.U.VAL % RHS.U.VAL;
    Quotient = APInt(BitWidth, QuotVal);
    Remainder = APInt(BitWidth, RemVal);
    return;
  }

  // Get some size facts about the dividend and divisor
  unsigned lhsWords = getNumWords(LHS.getActiveBits());
  unsigned rhsBits  = RHS.getActiveBits();
  unsigned rhsWords = getNumWords(rhsBits);
  assert(rhsWords && "Performing divrem operation by zero ???");

  // Check the degenerate cases
  if (lhsWords == 0) {
    Quotient = APInt(BitWidth, 0);    // 0 / Y ===> 0
    Remainder = APInt(BitWidth, 0);   // 0 % Y ===> 0
    return;
  }

  if (rhsBits == 1) {
    Quotient = LHS;                   // X / 1 ===> X
    Remainder = APInt(BitWidth, 0);   // X % 1 ===> 0
  }

  if (lhsWords < rhsWords || LHS.ult(RHS)) {
    Remainder = LHS;                  // X % Y ===> X, iff X < Y
    Quotient = APInt(BitWidth, 0);    // X / Y ===> 0, iff X < Y
    return;
  }

  if (LHS == RHS) {
    Quotient  = APInt(BitWidth, 1);   // X / X ===> 1
    Remainder = APInt(BitWidth, 0);   // X % X ===> 0;
    return;
  }

  // Make sure there is enough space to hold the results.
  // NOTE: This assumes that reallocate won't affect any bits if it doesn't
  // change the size. This is necessary if Quotient or Remainder is aliased
  // with LHS or RHS.
  Quotient.reallocate(BitWidth);
  Remainder.reallocate(BitWidth);

  if (lhsWords == 1) { // rhsWords is 1 if lhsWords is 1.
    // There is only one word to consider so use the native versions.
    uint64_t lhsValue = LHS.U.pVal[0];
    uint64_t rhsValue = RHS.U.pVal[0];
    Quotient = lhsValue / rhsValue;
    Remainder = lhsValue % rhsValue;
    return;
  }

  // Okay, lets do it the long way
  divide(LHS.U.pVal, lhsWords, RHS.U.pVal, rhsWords, Quotient.U.pVal,
         Remainder.U.pVal);
  // Clear the rest of the Quotient and Remainder.
  std::memset(Quotient.U.pVal + lhsWords, 0,
              (getNumWords(BitWidth) - lhsWords) * APINT_WORD_SIZE);
  std::memset(Remainder.U.pVal + rhsWords, 0,
              (getNumWords(BitWidth) - rhsWords) * APINT_WORD_SIZE);
}